

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall
ghc::filesystem::path::path<char[2],ghc::filesystem::path>(path *this,char (*source) [2],format fmt)

{
  char *pcVar1;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  allocator local_39;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)&local_38,*source,&local_39);
  (this->_path)._M_dataplus._M_p = (pointer)&(this->_path).field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)this,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  pcVar1 = (this->_path)._M_dataplus._M_p;
  uVar2 = (this->_path)._M_string_length;
  if ((((uVar2 < 3) || (*pcVar1 != '/')) || (pcVar1[1] != '/')) || (pcVar1[2] == '/')) {
    _Var3 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (pcVar1,pcVar1 + uVar2);
  }
  else {
    _Var3 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (pcVar1 + 2,pcVar1 + uVar2);
  }
  (this->_path)._M_string_length = (long)_Var3._M_current - (long)(this->_path)._M_dataplus._M_p;
  *_Var3._M_current = '\0';
  return;
}

Assistant:

_path(detail::toWChar(source))
#else
    : _path(detail::toUtf8(source))
#endif
{
    postprocess_path_with_format(fmt);
}